

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

_Bool upb_MapIterator_Done(upb_Map *map,size_t iter)

{
  _Bool _Var1;
  upb_strtable_iter i;
  
  if (iter != 0xffffffffffffffff) {
    i.t = &map->table;
    i.index = iter;
    _Var1 = upb_strtable_done(&i);
    return _Var1;
  }
  __assert_fail("iter != ((size_t) - 1)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/message/map.c"
                ,0x60,"_Bool upb_MapIterator_Done(const upb_Map *, size_t)");
}

Assistant:

bool upb_MapIterator_Done(const upb_Map* map, size_t iter) {
  upb_strtable_iter i;
  UPB_ASSERT(iter != kUpb_Map_Begin);
  i.t = &map->table;
  i.index = iter;
  return upb_strtable_done(&i);
}